

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this,_IO_FILE *f)

{
  span<char> sVar1;
  char *local_28;
  span<char> buf;
  _IO_FILE *f_local;
  file_print_buffer<_IO_FILE,_void> *this_local;
  
  buffer<char>::buffer(&this->super_buffer<char>,grow,0);
  glibc_file<_IO_FILE>::file_base(&this->file_,f);
  flockfile((FILE *)f);
  glibc_file<_IO_FILE>::init_buffer(&this->file_);
  sVar1 = glibc_file<_IO_FILE>::get_write_buffer(&this->file_);
  local_28 = sVar1.data;
  buf.data = (char *)sVar1.size;
  buffer<char>::set(&this->super_buffer<char>,local_28,(size_t)buf.data);
  return;
}

Assistant:

explicit file_print_buffer(F* f) : buffer(grow, size_t()), file_(f) {
    flockfile(f);
    file_.init_buffer();
    auto buf = file_.get_write_buffer();
    set(buf.data, buf.size);
  }